

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::FullyConnectedLayer::outputInplace(FullyConnectedLayer *this,Array *inputs)

{
  valarray<float> *this_00;
  
  this_00 = (this->super_ABackpropLayer).shared.outputBuffer.
            super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_M_size != this->nOutputs) {
    std::valarray<float>::resize(this_00,this->nOutputs,0.0);
  }
  rememberInputs(this,inputs);
  calcInducedLocalField(this,inputs);
  calcActivationGrad(this);
  calcOutput(this);
  return;
}

Assistant:

void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nOutputs) {
            outputs.resize(nOutputs);
        }
        rememberInputs(inputs);
        calcInducedLocalField(inputs);
        calcActivationGrad();
        calcOutput();
    }